

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamANCF_3243.cpp
# Opt level: O3

double __thiscall
chrono::fea::ChElementBeamANCF_3243::GetVonMissesStress
          (ChElementBeamANCF_3243 *this,double xi,double eta,double zeta)

{
  double *pdVar1;
  double *pdVar2;
  undefined8 uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  ChMaterialBeamANCF *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  double *pdVar12;
  double *pdVar13;
  double *pdVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  Matrix3xN *pMVar21;
  double *pdVar22;
  Index row;
  long lVar23;
  undefined1 (*pauVar24) [64];
  ActualDstType actualDst;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [32];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  double dVar49;
  double dVar56;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  ChMatrixNMc<double,_3,_3> F;
  ChVectorN<double,_6> sigmaPK2;
  ChMatrixNM<double,_3,_3> SPK2;
  ChMatrix33<double> J_0xi;
  MatrixNx3c Sxi_D;
  ChMatrixNM<double,_6,_6> D;
  ChMatrix33<double> S;
  Matrix3xN e_bar;
  undefined1 local_5a0 [8];
  double dStack_598;
  double local_590 [4];
  double dStack_570;
  double local_568;
  double local_560;
  double dStack_558;
  double local_550;
  undefined1 local_540 [16];
  undefined1 local_530 [16];
  double local_520 [10];
  double dStack_4d0;
  undefined1 local_4c8 [16];
  double dStack_4b8;
  double dStack_4b0;
  undefined1 local_4a0 [16];
  undefined1 local_490 [16];
  undefined1 local_480 [16];
  double local_470;
  double dStack_468;
  undefined1 local_460 [16];
  undefined1 local_450 [16];
  double local_440;
  double dStack_438;
  double local_430;
  double dStack_428;
  double local_420;
  double adStack_418 [2];
  Matrix<double,_3,_3,_1,_3,_3> local_408;
  undefined1 local_3c0 [64];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  assign_op<double,_double> *local_2f0;
  double *local_2e8;
  assign_op<double,_double> *local_2e0;
  double local_2d0;
  undefined1 local_2c0 [16];
  double dStack_2b0;
  double dStack_2a8;
  double dStack_2a0;
  double dStack_298;
  double dStack_290;
  double dStack_288;
  double local_280;
  double dStack_278;
  double *pdStack_270;
  Matrix<double,_3,_3,_1,_3,_3> *pMStack_268;
  double dStack_260;
  undefined1 auStack_258 [24];
  undefined1 local_240 [64];
  ChMatrix33<double> local_188;
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  
  pdVar22 = (double *)local_3c0;
  Calc_Sxi_D(this,(MatrixNx3c *)pdVar22,xi,eta,zeta);
  pMVar21 = &this->m_ebar0;
  lVar23 = 0x10;
  do {
    auVar32 = *(undefined1 (*) [64])
               (pMVar21->super_PlainObjectBase<Eigen::Matrix<double,_3,_8,_1,_3,_8>_>).m_storage.
               m_data.array;
    pMVar21 = (Matrix3xN *)
              ((pMVar21->super_PlainObjectBase<Eigen::Matrix<double,_3,_8,_1,_3,_8>_>).m_storage.
               m_data.array + 8);
    auVar30 = vmulpd_avx512f(auVar32,local_3c0);
    auVar27 = vextractf64x4_avx512f(auVar30,1);
    auVar31 = vmulpd_avx512f(auVar32,local_380);
    auVar32 = vmulpd_avx512f(auVar32,local_340);
    auVar28 = vextractf64x4_avx512f(auVar31,1);
    auVar29 = vextractf64x4_avx512f(auVar32,1);
    *(double *)((long)adStack_418 + lVar23) =
         auVar30._0_8_ + auVar27._0_8_ + auVar30._8_8_ + auVar27._8_8_ +
         auVar30._16_8_ + auVar27._16_8_ + auVar30._24_8_ + auVar27._24_8_;
    *(double *)((long)adStack_418 + lVar23 + 8) =
         auVar31._0_8_ + auVar28._0_8_ + auVar31._8_8_ + auVar28._8_8_ +
         auVar31._16_8_ + auVar28._16_8_ + auVar31._24_8_ + auVar28._24_8_;
    dVar49 = auVar32._0_8_ + auVar29._0_8_ + auVar32._8_8_ + auVar29._8_8_;
    dVar56 = auVar32._16_8_ + auVar29._16_8_ + auVar32._24_8_ + auVar29._24_8_;
    auVar50._0_8_ = dVar49 + dVar56;
    auVar50._8_8_ = dVar49 + dVar56;
    uVar3 = vmovlpd_avx(auVar50);
    *(undefined8 *)
     ((long)local_408.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
            array + lVar23) = uVar3;
    lVar23 = lVar23 + 0x18;
  } while (lVar23 != 0x58);
  local_140._8_8_ = &local_408;
  local_2c0._0_8_ = pdVar22;
  local_140._0_8_ = pdVar22;
  Eigen::internal::
  Assignment<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Inverse<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
  ::run((Matrix<double,_3,_3,_1,_3,_3> *)(local_2c0 + 8),(SrcXprType *)(local_140 + 8),
        (assign_op<double,_double> *)local_590);
  pdStack_270 = (double *)local_2c0._0_8_;
  dStack_260 = 1.48219693752374e-323;
  auVar32 = *(undefined1 (*) [64])local_2c0._0_8_;
  auVar30 = *(undefined1 (*) [64])(local_2c0._0_8_ + 0x40);
  auVar31 = *(undefined1 (*) [64])(local_2c0._0_8_ + 0x80);
  auVar33._8_8_ = local_2c0._8_8_;
  auVar33._0_8_ = local_2c0._8_8_;
  auVar33._16_8_ = local_2c0._8_8_;
  auVar33._24_8_ = local_2c0._8_8_;
  auVar33._32_8_ = local_2c0._8_8_;
  auVar33._40_8_ = local_2c0._8_8_;
  auVar33._48_8_ = local_2c0._8_8_;
  auVar33._56_8_ = local_2c0._8_8_;
  auVar33 = vmulpd_avx512f(auVar32,auVar33);
  auVar34._8_8_ = dStack_2b0;
  auVar34._0_8_ = dStack_2b0;
  auVar34._16_8_ = dStack_2b0;
  auVar34._24_8_ = dStack_2b0;
  auVar34._32_8_ = dStack_2b0;
  auVar34._40_8_ = dStack_2b0;
  auVar34._48_8_ = dStack_2b0;
  auVar34._56_8_ = dStack_2b0;
  auVar34 = vmulpd_avx512f(auVar32,auVar34);
  auVar35._8_8_ = dStack_2a8;
  auVar35._0_8_ = dStack_2a8;
  auVar35._16_8_ = dStack_2a8;
  auVar35._24_8_ = dStack_2a8;
  auVar35._32_8_ = dStack_2a8;
  auVar35._40_8_ = dStack_2a8;
  auVar35._48_8_ = dStack_2a8;
  auVar35._56_8_ = dStack_2a8;
  auVar35 = vmulpd_avx512f(auVar32,auVar35);
  auVar32._8_8_ = dStack_2a0;
  auVar32._0_8_ = dStack_2a0;
  auVar32._16_8_ = dStack_2a0;
  auVar32._24_8_ = dStack_2a0;
  auVar32._32_8_ = dStack_2a0;
  auVar32._40_8_ = dStack_2a0;
  auVar32._48_8_ = dStack_2a0;
  auVar32._56_8_ = dStack_2a0;
  auVar32 = vfmadd231pd_avx512f(auVar33,auVar30,auVar32);
  auVar8._8_8_ = dStack_298;
  auVar8._0_8_ = dStack_298;
  auVar8._16_8_ = dStack_298;
  auVar8._24_8_ = dStack_298;
  auVar8._32_8_ = dStack_298;
  auVar8._40_8_ = dStack_298;
  auVar8._48_8_ = dStack_298;
  auVar8._56_8_ = dStack_298;
  auVar33 = vfmadd231pd_avx512f(auVar34,auVar30,auVar8);
  auVar9._8_8_ = dStack_290;
  auVar9._0_8_ = dStack_290;
  auVar9._16_8_ = dStack_290;
  auVar9._24_8_ = dStack_290;
  auVar9._32_8_ = dStack_290;
  auVar9._40_8_ = dStack_290;
  auVar9._48_8_ = dStack_290;
  auVar9._56_8_ = dStack_290;
  auVar34 = vfmadd231pd_avx512f(auVar35,auVar30,auVar9);
  auVar30._8_8_ = dStack_288;
  auVar30._0_8_ = dStack_288;
  auVar30._16_8_ = dStack_288;
  auVar30._24_8_ = dStack_288;
  auVar30._32_8_ = dStack_288;
  auVar30._40_8_ = dStack_288;
  auVar30._48_8_ = dStack_288;
  auVar30._56_8_ = dStack_288;
  local_3c0 = vfmadd231pd_avx512f(auVar32,auVar31,auVar30);
  auVar10._8_8_ = local_280;
  auVar10._0_8_ = local_280;
  auVar10._16_8_ = local_280;
  auVar10._24_8_ = local_280;
  auVar10._32_8_ = local_280;
  auVar10._40_8_ = local_280;
  auVar10._48_8_ = local_280;
  auVar10._56_8_ = local_280;
  local_380 = vfmadd231pd_avx512f(auVar33,auVar31,auVar10);
  auVar11._8_8_ = dStack_278;
  auVar11._0_8_ = dStack_278;
  auVar11._16_8_ = dStack_278;
  auVar11._24_8_ = dStack_278;
  auVar11._32_8_ = dStack_278;
  auVar11._40_8_ = dStack_278;
  auVar11._48_8_ = dStack_278;
  auVar11._56_8_ = dStack_278;
  local_340 = vfmadd231pd_avx512f(auVar34,auVar31,auVar11);
  pMStack_268 = (Matrix<double,_3,_3,_1,_3,_3> *)(local_2c0 + 8);
  CalcCoordMatrix(this,(Matrix3xN *)local_140);
  auVar31._8_8_ = local_140._8_8_;
  auVar31._0_8_ = local_140._0_8_;
  auVar31._16_48_ = local_140._16_48_;
  lVar23 = 0x10;
  do {
    auVar32 = *(undefined1 (*) [64])pdVar22;
    pdVar22 = pdVar22 + 8;
    auVar30 = vmulpd_avx512f(auVar31,auVar32);
    auVar27 = vextractf64x4_avx512f(auVar30,1);
    auVar33 = vmulpd_avx512f(auVar32,local_100);
    auVar32 = vmulpd_avx512f(auVar32,local_c0);
    auVar28 = vextractf64x4_avx512f(auVar33,1);
    auVar29 = vextractf64x4_avx512f(auVar32,1);
    *(double *)(local_5a0 + lVar23) =
         auVar30._0_8_ + auVar27._0_8_ + auVar30._8_8_ + auVar27._8_8_ +
         auVar30._16_8_ + auVar27._16_8_ + auVar30._24_8_ + auVar27._24_8_;
    *(double *)(local_5a0 + lVar23 + 8) =
         auVar33._0_8_ + auVar28._0_8_ + auVar33._8_8_ + auVar28._8_8_ +
         auVar33._16_8_ + auVar28._16_8_ + auVar33._24_8_ + auVar28._24_8_;
    dVar49 = auVar32._0_8_ + auVar29._0_8_ + auVar32._8_8_ + auVar29._8_8_;
    dVar56 = auVar32._16_8_ + auVar29._16_8_ + auVar32._24_8_ + auVar29._24_8_;
    auVar25._0_8_ = dVar49 + dVar56;
    auVar25._8_8_ = dVar49 + dVar56;
    uVar3 = vmovlpd_avx(auVar25);
    *(undefined8 *)((long)local_590 + lVar23) = uVar3;
    lVar23 = lVar23 + 0x18;
  } while (lVar23 != 0x58);
  auVar15._8_8_ = local_590[3];
  auVar15._0_8_ = local_590[2];
  dStack_598 = 0.0;
  local_5a0 = (undefined1  [8])local_568;
  auVar62._8_8_ = 0;
  auVar62._0_8_ = local_550;
  auVar50 = vunpcklpd_avx(auVar15,_local_5a0);
  auVar36._0_8_ =
       auVar50._0_8_ * auVar50._0_8_ + local_590[0] * local_590[0] + local_590[1] * local_590[1];
  auVar36._8_8_ =
       auVar50._8_8_ * auVar50._8_8_ + local_590[3] * local_590[3] + dStack_570 * dStack_570;
  auVar6._8_8_ = 0xbff0000000000000;
  auVar6._0_8_ = 0xbff0000000000000;
  auVar25 = vaddpd_avx512vl(auVar36,auVar6);
  auVar26._8_8_ = 0x3fe0000000000000;
  auVar26._0_8_ = 0x3fe0000000000000;
  local_530 = vmulpd_avx512vl(auVar25,auVar26);
  auVar25 = vunpcklpd_avx(auVar62,_local_5a0);
  local_540._8_8_ =
       local_590[2] * auVar25._8_8_ + local_590[0] * local_590[3] + local_590[1] * dStack_570;
  local_540._0_8_ =
       local_590[2] * auVar25._0_8_ + local_590[0] * local_560 + local_590[1] * dStack_558;
  auVar65._8_8_ = 0;
  auVar65._0_8_ =
       (local_550 * local_550 + local_560 * local_560 + dStack_558 * dStack_558 + -1.0) * 0.5;
  auVar64._8_8_ = 0;
  auVar64._0_8_ = local_568 * local_550 + local_590[3] * local_560 + dStack_570 * dStack_558;
  if (this->m_damping_enabled == true) {
    local_470 = local_590[2];
    dStack_468 = local_590[2];
    local_440 = local_560;
    dStack_438 = dStack_558;
    local_430 = local_590[3];
    dStack_428 = dStack_570;
    local_420 = local_590[0];
    adStack_418[0] = local_590[1];
    local_4a0 = auVar65;
    local_490 = auVar50;
    local_480 = auVar64;
    local_460 = auVar25;
    local_450 = auVar62;
    CalcCoordDerivMatrix(this,(Matrix3xN *)local_2c0);
    auVar19._8_8_ = local_2c0._8_8_;
    auVar19._0_8_ = local_2c0._0_8_;
    auVar19._16_8_ = dStack_2b0;
    auVar19._24_8_ = dStack_2a8;
    auVar19._32_8_ = dStack_2a0;
    auVar19._40_8_ = dStack_298;
    auVar19._48_8_ = dStack_290;
    auVar19._56_8_ = dStack_288;
    auVar20._8_8_ = dStack_278;
    auVar20._0_8_ = local_280;
    auVar20._16_8_ = pdStack_270;
    auVar20._24_8_ = pMStack_268;
    auVar20._32_8_ = dStack_260;
    auVar20._40_24_ = auStack_258;
    lVar23 = 0x10;
    pauVar24 = &local_3c0;
    do {
      auVar32 = *pauVar24;
      pauVar24 = pauVar24 + 1;
      auVar30 = vmulpd_avx512f(auVar19,auVar32);
      auVar27 = vextractf64x4_avx512f(auVar30,1);
      auVar31 = vmulpd_avx512f(auVar32,auVar20);
      auVar32 = vmulpd_avx512f(auVar32,local_240);
      auVar28 = vextractf64x4_avx512f(auVar31,1);
      auVar29 = vextractf64x4_avx512f(auVar32,1);
      *(double *)((long)local_520 + lVar23 + 0x20) =
           auVar30._0_8_ + auVar27._0_8_ + auVar30._8_8_ + auVar27._8_8_ +
           auVar30._16_8_ + auVar27._16_8_ + auVar30._24_8_ + auVar27._24_8_;
      *(double *)((long)local_520 + lVar23 + 0x28) =
           auVar31._0_8_ + auVar28._0_8_ + auVar31._8_8_ + auVar28._8_8_ +
           auVar31._16_8_ + auVar28._16_8_ + auVar31._24_8_ + auVar28._24_8_;
      dVar49 = auVar32._0_8_ + auVar29._0_8_ + auVar32._8_8_ + auVar29._8_8_;
      dVar56 = auVar32._16_8_ + auVar29._16_8_ + auVar32._24_8_ + auVar29._24_8_;
      auVar51._0_8_ = dVar49 + dVar56;
      auVar51._8_8_ = dVar49 + dVar56;
      uVar3 = vmovlpd_avx(auVar51);
      *(undefined8 *)((long)local_520 + lVar23 + 0x30) = uVar3;
      lVar23 = lVar23 + 0x18;
    } while (lVar23 != 0x58);
    auVar57._8_8_ = 0;
    auVar57._0_8_ = local_4c8._0_8_;
    auVar61._8_8_ = 0;
    auVar61._0_8_ = dStack_4b0;
    auVar18._8_8_ = local_520[9];
    auVar18._0_8_ = local_520[8];
    auVar50 = vunpcklpd_avx(auVar18,auVar57);
    auVar44._0_8_ =
         auVar50._0_8_ * (double)local_490._0_8_ +
         local_420 * local_520[6] + adStack_418[0] * local_520[7];
    auVar44._8_8_ =
         auVar50._8_8_ * (double)local_490._8_8_ +
         local_430 * local_520[9] + dStack_428 * dStack_4d0;
    auVar52._8_8_ = this->m_Alpha;
    auVar52._0_8_ = this->m_Alpha;
    local_530 = vfmadd231pd_fma(local_530,auVar52,auVar44);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = local_4a0._0_8_;
    auVar59._8_8_ = 0;
    auVar59._0_8_ =
         (double)local_450._0_8_ * dStack_4b0 +
         local_440 * (double)local_4c8._8_8_ + dStack_438 * dStack_4b8;
    auVar25 = vfmadd213sd_fma(auVar59,auVar52,auVar4);
    auVar50 = vunpcklpd_avx(auVar61,auVar57);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = local_480._0_8_;
    auVar63._8_8_ = 0;
    auVar63._0_8_ =
         dStack_4b0 * (double)local_5a0 +
         local_430 * (double)local_4c8._8_8_ + dStack_428 * dStack_4b8 +
         (double)local_450._0_8_ * (double)local_4c8._0_8_ +
         local_440 * local_520[9] + dStack_438 * dStack_4d0;
    auVar6 = vfmadd213sd_fma(auVar63,auVar52,auVar5);
    auVar7._8_8_ = local_520[8];
    auVar7._0_8_ = local_520[8];
    auVar26 = vmulpd_avx512vl(local_460,auVar7);
    _local_5a0 = vunpcklpd_avx(auVar25,auVar6);
    auVar37._0_8_ =
         auVar26._0_8_ + local_440 * local_520[6] + dStack_438 * local_520[7] +
         auVar50._0_8_ * local_470 +
         local_420 * (double)local_4c8._8_8_ + adStack_418[0] * dStack_4b8;
    auVar37._8_8_ =
         auVar26._8_8_ + local_430 * local_520[6] + dStack_428 * local_520[7] +
         auVar50._8_8_ * dStack_468 + local_420 * local_520[9] + adStack_418[0] * dStack_4d0;
    local_540 = vfmadd231pd_fma(local_540,auVar52,auVar37);
  }
  else {
    _local_5a0 = vunpcklpd_avx(auVar65,auVar64);
  }
  this_00 = (this->m_material).
            super___shared_ptr<chrono::fea::ChMaterialBeamANCF,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_01 = (this->m_material).
            super___shared_ptr<chrono::fea::ChMaterialBeamANCF,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_01->_M_use_count = this_01->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_01->_M_use_count = this_01->_M_use_count + 1;
    }
  }
  ChMaterialBeamANCF::Get_D(this_00,(ChMatrixNM<double,_6,_6> *)local_2c0);
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  pdVar22 = &dStack_2a0;
  lVar23 = 0;
  do {
    pdVar1 = pdVar22 + -2;
    pdVar12 = pdVar22 + -1;
    dVar49 = *pdVar22;
    pdVar13 = pdVar22 + 1;
    pdVar2 = pdVar22 + -4;
    pdVar14 = pdVar22 + -3;
    pdVar22 = pdVar22 + 6;
    dVar49 = (double)local_530._0_8_ * *pdVar2 +
             (double)local_5a0 * *pdVar1 + (double)local_540._0_8_ * dVar49;
    dVar56 = (double)local_530._8_8_ * *pdVar14 +
             dStack_598 * *pdVar12 + (double)local_540._8_8_ * *pdVar13;
    auVar38._0_8_ = dVar49 + dVar56;
    auVar38._8_8_ = dVar49 + dVar56;
    dVar49 = (double)vmovlpd_avx(auVar38);
    local_520[lVar23] = dVar49;
    lVar23 = lVar23 + 1;
  } while (lVar23 != 6);
  local_2e8 = local_520 + 6;
  auVar27._8_8_ = local_520[2];
  auVar27._0_8_ = local_520[2];
  auVar27._16_8_ = local_520[2];
  auVar27._24_8_ = local_520[2];
  auVar53._8_8_ = 0;
  auVar53._0_8_ = local_568;
  auVar60._8_8_ = 0;
  auVar60._0_8_ = local_590[1];
  local_520[6] = local_520[0];
  dStack_4d0 = local_520[1];
  auVar16._8_8_ = local_520[4];
  auVar16._0_8_ = local_520[3];
  auVar17._8_8_ = local_520[5];
  auVar17._0_8_ = local_520[4];
  auVar50 = vunpcklpd_avx(auVar16,auVar17);
  auVar27 = vblendpd_avx(ZEXT1632(auVar50),auVar27,8);
  _local_4c8 = vpermpd_avx2(auVar27,0xc4);
  auVar50 = vshufpd_avx(auVar17,auVar17,1);
  auVar45._8_8_ = 0;
  auVar45._0_8_ = local_550;
  local_520[7] = auVar50._0_8_;
  local_520[8] = auVar50._8_8_;
  auVar47._8_8_ = 0;
  auVar47._0_8_ = local_590[2] * dStack_558;
  auVar50 = vfmsub231sd_fma(auVar47,auVar60,auVar45);
  local_520[9] = local_520[5];
  auVar39._8_8_ = 0;
  auVar39._0_8_ = dStack_570;
  auVar58._8_8_ = 0;
  auVar58._0_8_ = local_568 * dStack_558;
  auVar25 = vfmsub231sd_fma(auVar58,auVar39,auVar45);
  auVar40._8_8_ = 0;
  auVar40._0_8_ = local_590[2] * dStack_570;
  auVar6 = vfmsub231sd_fma(auVar40,auVar60,auVar53);
  local_2d0 = auVar6._0_8_ * local_560 +
              (auVar25._0_8_ * local_590[0] - auVar50._0_8_ * local_590[3]);
  local_2f0 = (assign_op<double,_double> *)local_590;
  local_2e0 = (assign_op<double,_double> *)local_590;
  ChMatrix33<double>::
  ChMatrix33<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Product<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,1,3,3>,0>,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>,0>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const>>
            (&local_188,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>_>
              *)&local_2f0);
  auVar48._8_8_ = 0;
  auVar48._0_8_ =
       local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  auVar41._8_8_ = 0;
  auVar41._0_8_ =
       (local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] -
       local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8]) *
       (local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] -
       local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8]);
  auVar54._8_8_ = 0;
  auVar54._0_8_ =
       local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] -
       local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  auVar50 = vfmadd231sd_fma(auVar41,auVar54,auVar54);
  auVar46._8_8_ = 0;
  auVar46._0_8_ =
       local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] -
       local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar50 = vfmadd213sd_fma(auVar46,auVar46,auVar50);
  auVar42._8_8_ = 0;
  auVar42._0_8_ =
       local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  auVar55._8_8_ = 0;
  auVar55._0_8_ =
       local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] *
       local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  auVar25 = vfmadd231sd_fma(auVar55,auVar42,auVar42);
  auVar25 = vfmadd231sd_fma(auVar25,auVar48,auVar48);
  auVar43._8_8_ = 0;
  auVar43._0_8_ = auVar25._0_8_ * 3.0;
  auVar50 = vfmadd231sd_fma(auVar43,auVar50,ZEXT816(0x3fe0000000000000));
  if (auVar50._0_8_ < 0.0) {
    dVar49 = sqrt(auVar50._0_8_);
  }
  else {
    auVar50 = vsqrtsd_avx(auVar50,auVar50);
    dVar49 = auVar50._0_8_;
  }
  return dVar49;
}

Assistant:

double ChElementBeamANCF_3243::GetVonMissesStress(const double xi, const double eta, const double zeta) {
    MatrixNx3c Sxi_D;  // Matrix of normalized shape function derivatives
    Calc_Sxi_D(Sxi_D, xi, eta, zeta);

    ChMatrix33<double> J_0xi;  // Element Jacobian between the reference configuration and normalized configuration
    J_0xi.noalias() = m_ebar0 * Sxi_D;

    Sxi_D = Sxi_D * J_0xi.inverse();  // Adjust the shape function derivative matrix to account for the potentially
                                      // distorted reference configuration

    Matrix3xN e_bar;  // Element coordinates in matrix form
    CalcCoordMatrix(e_bar);

    // Calculate the Deformation Gradient at the current point
    ChMatrixNMc<double, 3, 3> F = e_bar * Sxi_D;

    // Calculate the Green-Lagrange strain tensor at the current point in Voigt notation
    ChVectorN<double, 6> epsilon_combined;
    epsilon_combined(0) = 0.5 * (F.col(0).dot(F.col(0)) - 1);
    epsilon_combined(1) = 0.5 * (F.col(1).dot(F.col(1)) - 1);
    epsilon_combined(2) = 0.5 * (F.col(2).dot(F.col(2)) - 1);
    epsilon_combined(3) = F.col(1).dot(F.col(2));
    epsilon_combined(4) = F.col(0).dot(F.col(2));
    epsilon_combined(5) = F.col(0).dot(F.col(1));

    if (m_damping_enabled) {
        Matrix3xN ebardot;  // Element coordinate time derivatives in matrix form
        CalcCoordDerivMatrix(ebardot);

        // Calculate the time derivative of the Deformation Gradient at the current point
        ChMatrixNMc<double, 3, 3> Fdot = ebardot * Sxi_D;

        // Calculate the time derivative of the Green-Lagrange strain tensor in Voigt notation
        // and combine it with epsilon assuming a Linear Kelvin-Voigt Viscoelastic material model
        epsilon_combined(0) += m_Alpha * F.col(0).dot(Fdot.col(0));
        epsilon_combined(1) += m_Alpha * F.col(1).dot(Fdot.col(1));
        epsilon_combined(2) += m_Alpha * F.col(2).dot(Fdot.col(2));
        epsilon_combined(3) += m_Alpha * (F.col(1).dot(Fdot.col(2)) + Fdot.col(1).dot(F.col(2)));
        epsilon_combined(4) += m_Alpha * (F.col(0).dot(Fdot.col(2)) + Fdot.col(0).dot(F.col(2)));
        epsilon_combined(5) += m_Alpha * (F.col(0).dot(Fdot.col(1)) + Fdot.col(0).dot(F.col(1)));
    }

    ChMatrixNM<double, 6, 6> D;
    GetMaterial()->Get_D(D);

    ChVectorN<double, 6> sigmaPK2 = D * epsilon_combined;  // 2nd Piola Kirchhoff Stress tensor in Voigt notation

    ChMatrixNM<double, 3, 3> SPK2;  // 2nd Piola Kirchhoff Stress tensor
    SPK2(0, 0) = sigmaPK2(0);
    SPK2(1, 1) = sigmaPK2(1);
    SPK2(2, 2) = sigmaPK2(2);
    SPK2(1, 2) = sigmaPK2(3);
    SPK2(2, 1) = sigmaPK2(3);
    SPK2(0, 2) = sigmaPK2(4);
    SPK2(2, 0) = sigmaPK2(4);
    SPK2(0, 1) = sigmaPK2(5);
    SPK2(1, 0) = sigmaPK2(5);

    // Convert from 2ndPK Stress to Cauchy Stress
    ChMatrix33<double> S = (F * SPK2 * F.transpose()) / F.determinant();
    double SVonMises =
        sqrt(0.5 * ((S(0, 0) - S(1, 1)) * (S(0, 0) - S(1, 1)) + (S(1, 1) - S(2, 2)) * (S(1, 1) - S(2, 2)) +
                    (S(2, 2) - S(0, 0)) * (S(2, 2) - S(0, 0))) +
             3 * (S(1, 2) * S(1, 2) + S(2, 0) * S(2, 0) + S(0, 1) * S(0, 1)));

    return (SVonMises);
}